

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O1

void __thiscall
QMenuPrivate::activateCausedStack
          (QMenuPrivate *this,QList<QPointer<QWidget>_> *causedStack,QAction *action,
          ActionEvent action_e,bool self)

{
  bool bVar1;
  QPointer<QWidget> *pQVar2;
  int *piVar3;
  long lVar4;
  bool bVar5;
  int *piVar6;
  QObject *pQVar7;
  QMenuBar *this_00;
  int iVar8;
  long lVar9;
  int *piVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  QAction *local_50;
  void *local_48;
  QAction **ppQStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = *(QObject **)&(this->super_QWidgetPrivate).field_0x8;
  bVar1 = this->activationRecursionGuard;
  this->activationRecursionGuard = true;
  if (pQVar7 == (QObject *)0x0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar7);
  }
  if (self) {
    QAction::activate((ActionEvent)action);
  }
  if (piVar6 != (int *)0x0) {
    if ((pQVar7 != (QObject *)0x0) && (piVar6[1] != 0)) {
      if ((causedStack->d).size != 0) {
        lVar9 = 8;
        uVar11 = 0;
        do {
          pQVar2 = (causedStack->d).ptr;
          piVar3 = *(int **)((long)pQVar2 + lVar9 + -8);
          bVar5 = false;
          piVar10 = piVar3;
          if (piVar3 != (int *)0x0) {
            lVar4 = *(long *)((long)&(pQVar2->wp).d + lVar9);
            LOCK();
            *piVar3 = *piVar3 + 1;
            UNLOCK();
            if (lVar4 != 0 && piVar3[1] != 0) {
              pQVar7 = (QObject *)QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
              if (pQVar7 == (QObject *)0x0) {
                this_00 = (QMenuBar *)QMetaObject::cast((QObject *)&QMenuBar::staticMetaObject);
                if (this_00 == (QMenuBar *)0x0) {
                  bVar5 = false;
                }
                else {
                  bVar5 = true;
                  if (action_e == Hover) {
                    QMenuBar::hovered(this_00,action);
                  }
                  else if (action_e == Trigger) {
                    QMenuBar::triggered(this_00,action);
                  }
                }
              }
              else {
                piVar10 = *(int **)(*(long *)(pQVar7 + 8) + 0x2f8);
                if (piVar10 != (int *)0x0) {
                  LOCK();
                  *piVar10 = *piVar10 + 1;
                  UNLOCK();
                }
                if (piVar3 != (int *)0x0) {
                  LOCK();
                  *piVar3 = *piVar3 + -1;
                  UNLOCK();
                  if (*piVar3 == 0) {
                    operator_delete(piVar3);
                  }
                }
                bVar5 = false;
                if (action_e == Hover) {
                  iVar8 = 3;
                }
                else {
                  if (action_e != Trigger) goto LAB_004618f2;
                  iVar8 = 2;
                }
                ppQStack_40 = &local_50;
                local_48 = (void *)0x0;
                local_50 = action;
                QMetaObject::activate(pQVar7,&QMenu::staticMetaObject,iVar8,&local_48);
              }
            }
          }
LAB_004618f2:
          if (piVar10 != (int *)0x0) {
            LOCK();
            *piVar10 = *piVar10 + -1;
            UNLOCK();
            if (*piVar10 == 0) {
              operator_delete(piVar10);
            }
          }
          if (bVar5) break;
          uVar11 = uVar11 + 1;
          lVar9 = lVar9 + 0x10;
        } while (uVar11 < (ulong)(causedStack->d).size);
      }
      this->activationRecursionGuard = bVar1;
    }
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        operator_delete(piVar6);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenuPrivate::activateCausedStack(const QList<QPointer<QWidget>> &causedStack, QAction *action,
                                       QAction::ActionEvent action_e, bool self)
{
    Q_Q(QMenu);
    // can't use QScopedValueRollback here
    const bool activationRecursionGuardReset = activationRecursionGuard;
    activationRecursionGuard = true;
    QPointer<QMenu> guard(q);
    if (self)
        action->activate(action_e);
    if (!guard)
        return;
    auto boolBlocker = qScopeGuard([this, activationRecursionGuardReset]{
        activationRecursionGuard = activationRecursionGuardReset;
    });

    for(int i = 0; i < causedStack.size(); ++i) {
        QPointer<QWidget> widget = causedStack.at(i);
        if (!widget)
            continue;
        //fire
        if (QMenu *qmenu = qobject_cast<QMenu*>(widget)) {
            widget = qmenu->d_func()->causedPopup.widget;
            if (action_e == QAction::Trigger) {
                emit qmenu->triggered(action);
           } else if (action_e == QAction::Hover) {
                emit qmenu->hovered(action);
            }
#if QT_CONFIG(menubar)
        } else if (QMenuBar *qmenubar = qobject_cast<QMenuBar*>(widget)) {
            if (action_e == QAction::Trigger) {
                emit qmenubar->triggered(action);
            } else if (action_e == QAction::Hover) {
                emit qmenubar->hovered(action);
            }
            break; //nothing more..
#endif
        }
    }
}